

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_concurrency.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_24d31::
ARTConcurrencyTest_ParallelInsertOneTree_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTConcurrencyTest_ParallelInsertOneTree_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  long lVar1;
  long in_FS_OFFSET;
  long alStack_90 [2];
  array<unodb::qsbr_thread,_4UL> threads;
  thread local_60;
  _func_void_tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_ptr_unsigned_long_unsigned_long
  *local_58;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_38;
  
  local_38 = &(this->
              super_ARTConcurrencyTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ).verifier;
  alStack_90[0] = 0x11cac7;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::preinsert_key_range_to_verifier_only<int>(local_38,0,0x400);
  local_58 = ARTConcurrencyTest<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             ::parallel_insert_thread;
  alStack_90[0] = 0x11cae1;
  unodb::qsbr_per_thread::current_thread_instance::__tls_init();
  alStack_90[0] = 0x11caf1;
  unodb::qsbr_per_thread::qsbr_pause(*(qsbr_per_thread **)(in_FS_OFFSET + -0x10));
  alStack_90[1] = 0;
  threads._M_elems[0].super_thread._M_id._M_thread = (thread)(id)0x0;
  threads._M_elems[1].super_thread._M_id._M_thread = (thread)(id)0x0;
  threads._M_elems[2].super_thread._M_id._M_thread = (thread)(id)0x0;
  local_40 = 0;
  do {
    local_50 = local_38;
    local_48 = 0x100;
    alStack_90[0] = 0x11cb3c;
    unodb::qsbr_thread::
    make_qsbr_thread<void(*&)(unodb::test::tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>*,unsigned_long,unsigned_long),unodb::test::tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>*,unsigned_long&,unsigned_long>
              ((qsbr_thread *)&local_60,&local_58,&local_50,&local_40,&local_48);
    if (threads._M_elems[local_40 - 1].super_thread._M_id._M_thread != 0) goto LAB_0011cbea;
    threads._M_elems[local_40 - 1].super_thread._M_id._M_thread =
         (native_handle_type)local_60._M_id._M_thread;
    local_40 = local_40 + 1;
  } while (local_40 < 4);
  lVar1 = 0;
  do {
    alStack_90[0] = 0x11cb71;
    std::thread::join();
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  alStack_90[0] = 0x11cb8a;
  unodb::qsbr_per_thread::current_thread_instance::__tls_init();
  alStack_90[0] = 0x11cb9a;
  unodb::qsbr_per_thread::qsbr_resume(*(qsbr_per_thread **)(in_FS_OFFSET + -0x10));
  lVar1 = 0x20;
  while (*(long *)((long)alStack_90 + lVar1) == 0) {
    lVar1 = lVar1 + -8;
    if (lVar1 == 0) {
      alStack_90[0] = 0x11cbb9;
      unodb::test::
      tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
      ::check_present_values(local_38);
      return;
    }
  }
LAB_0011cbea:
  alStack_90[0] = 0x11cbef;
  std::terminate();
}

Assistant:

UNODB_TYPED_TEST(ARTConcurrencyTest, ParallelInsertOneTree) {
  constexpr auto thread_count = 4;
  constexpr auto total_keys = 1024;
  constexpr auto ops_per_thread = total_keys / thread_count;

  this->verifier.preinsert_key_range_to_verifier_only(0, total_keys);
  this->template parallel_test<thread_count, ops_per_thread>(
      TestFixture::parallel_insert_thread);
  this->verifier.check_present_values();
}